

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

bool __thiscall flatbuffers::rust::RustGenerator::GenerateIndividualFiles(RustGenerator *this)

{
  Parser *pPVar1;
  bool bVar2;
  bool local_99;
  anon_class_8_1_8991fb9c local_78;
  function<void_(const_flatbuffers::StructDef_&)> local_70;
  anon_class_8_1_8991fb9c local_40;
  function<void_(const_flatbuffers::EnumDef_&)> local_38;
  RustGenerator *local_18;
  RustGenerator *this_local;
  
  local_18 = this;
  CodeWriter::Clear(&this->code_);
  pPVar1 = (this->super_BaseGenerator).parser_;
  local_40.this = this;
  std::function<void(flatbuffers::EnumDef_const&)>::
  function<flatbuffers::rust::RustGenerator::GenerateIndividualFiles()::_lambda(flatbuffers::EnumDef_const&)_1_,void>
            ((function<void(flatbuffers::EnumDef_const&)> *)&local_38,&local_40);
  bVar2 = GenerateSymbols<flatbuffers::EnumDef>(this,&pPVar1->enums_,&local_38);
  local_99 = false;
  if (bVar2) {
    pPVar1 = (this->super_BaseGenerator).parser_;
    local_78.this = this;
    std::function<void(flatbuffers::StructDef_const&)>::
    function<flatbuffers::rust::RustGenerator::GenerateIndividualFiles()::_lambda(flatbuffers::StructDef_const&)_1_,void>
              ((function<void(flatbuffers::StructDef_const&)> *)&local_70,&local_78);
    local_99 = GenerateSymbols<flatbuffers::StructDef>(this,&pPVar1->structs_,&local_70);
  }
  this_local._7_1_ = local_99;
  if (bVar2) {
    std::function<void_(const_flatbuffers::StructDef_&)>::~function(&local_70);
  }
  std::function<void_(const_flatbuffers::EnumDef_&)>::~function(&local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GenerateIndividualFiles() {
    code_.Clear();
    // Don't bother with imports. Use absolute paths everywhere.
    return GenerateSymbols<EnumDef>(
               parser_.enums_, [&](const EnumDef &e) { this->GenEnum(e); }) &&
           GenerateSymbols<StructDef>(
               parser_.structs_, [&](const StructDef &s) {
                 if (s.fixed) {
                   this->GenStruct(s);
                 } else {
                   this->GenTable(s);
                   if (this->parser_.opts.generate_object_based_api) {
                     this->GenTableObject(s);
                   }
                 }
                 if (this->parser_.root_struct_def_ == &s) {
                   this->GenRootTableFuncs(s);
                 }
               });
  }